

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_bb_end(TCGContext_conflict9 *s,TCGRegSet allocated_regs)

{
  TCGRegSet allocated_regs_local;
  TCGContext_conflict9 *s_local;
  
  return;
}

Assistant:

static void tcg_reg_alloc_bb_end(TCGContext *s, TCGRegSet allocated_regs)
{
    // Unicorn: We are inserting brcond in the middle of the TB so the
    //          assumptions here won't be satisfied.
    // int i;

    // for (i = s->nb_globals; i < s->nb_temps; i++) {
    //     TCGTemp *ts = &s->temps[i];
    //     if (ts->temp_local) {
    //         temp_save(s, ts, allocated_regs);
    //     } else {
    //         /* The liveness analysis already ensures that temps are dead.
    //            Keep an tcg_debug_assert for safety. */
    //         tcg_debug_assert(ts->val_type == TEMP_VAL_DEAD);
    //     }
    // }

    // save_globals(s, allocated_regs);
}